

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.h
# Opt level: O3

void __thiscall
testing::internal::ParameterizedTestCaseRegistry::~ParameterizedTestCaseRegistry
          (ParameterizedTestCaseRegistry *this)

{
  pointer ppPVar1;
  pointer ppPVar2;
  
  ppPVar2 = (this->test_case_infos_).
            super__Vector_base<testing::internal::ParameterizedTestCaseInfoBase_*,_std::allocator<testing::internal::ParameterizedTestCaseInfoBase_*>_>
            ._M_impl.super__Vector_impl_data._M_start;
  ppPVar1 = (this->test_case_infos_).
            super__Vector_base<testing::internal::ParameterizedTestCaseInfoBase_*,_std::allocator<testing::internal::ParameterizedTestCaseInfoBase_*>_>
            ._M_impl.super__Vector_impl_data._M_finish;
  if (ppPVar2 != ppPVar1) {
    do {
      if (*ppPVar2 != (ParameterizedTestCaseInfoBase *)0x0) {
        (**(code **)(*(long *)*ppPVar2 + 8))();
        ppPVar1 = (this->test_case_infos_).
                  super__Vector_base<testing::internal::ParameterizedTestCaseInfoBase_*,_std::allocator<testing::internal::ParameterizedTestCaseInfoBase_*>_>
                  ._M_impl.super__Vector_impl_data._M_finish;
      }
      ppPVar2 = ppPVar2 + 1;
    } while (ppPVar2 != ppPVar1);
    ppPVar2 = (this->test_case_infos_).
              super__Vector_base<testing::internal::ParameterizedTestCaseInfoBase_*,_std::allocator<testing::internal::ParameterizedTestCaseInfoBase_*>_>
              ._M_impl.super__Vector_impl_data._M_start;
  }
  if (ppPVar2 != (pointer)0x0) {
    operator_delete(ppPVar2,(long)(this->test_case_infos_).
                                  super__Vector_base<testing::internal::ParameterizedTestCaseInfoBase_*,_std::allocator<testing::internal::ParameterizedTestCaseInfoBase_*>_>
                                  ._M_impl.super__Vector_impl_data._M_end_of_storage - (long)ppPVar2
                   );
    return;
  }
  return;
}

Assistant:

~ParameterizedTestCaseRegistry() {
    for (TestCaseInfoContainer::iterator it = test_case_infos_.begin();
         it != test_case_infos_.end(); ++it) {
      delete *it;
    }
  }